

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O2

string * __thiscall
flatbuffers::IntToStringHex_abi_cxx11_
          (string *__return_storage_ptr__,flatbuffers *this,int i,int xdigits)

{
  long lVar1;
  long lVar2;
  ostream *this_00;
  stringstream ss;
  long local_190 [2];
  long alStack_180 [45];
  
  if (-1 < (int)this) {
    std::__cxx11::stringstream::stringstream((stringstream *)&ss);
    *(long *)((long)alStack_180 + *(long *)(local_190[0] + -0x18)) = (long)i;
    this_00 = std::operator<<(local_190,0x30);
    lVar1 = *(long *)this_00;
    lVar2 = *(long *)(lVar1 + -0x18);
    *(uint *)(this_00 + lVar2 + 0x18) = *(uint *)(this_00 + lVar2 + 0x18) & 0xffffffb5 | 8;
    *(uint *)(this_00 + *(long *)(lVar1 + -0x18) + 0x18) =
         *(uint *)(this_00 + *(long *)(lVar1 + -0x18) + 0x18) | 0x4000;
    std::ostream::operator<<(this_00,(int)this);
    std::__cxx11::stringbuf::str();
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    return __return_storage_ptr__;
  }
  __assert_fail("i >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/include/flatbuffers/util.h"
                ,0xbf,"std::string flatbuffers::IntToStringHex(int, int)");
}

Assistant:

inline std::string IntToStringHex(int i, int xdigits) {
  FLATBUFFERS_ASSERT(i >= 0);
  // clang-format off

  #ifndef FLATBUFFERS_PREFER_PRINTF
    std::stringstream ss;
    ss << std::setw(xdigits) << std::setfill('0') << std::hex << std::uppercase
       << i;
    return ss.str();
  #else // FLATBUFFERS_PREFER_PRINTF
    return NumToStringImplWrapper(i, "%.*X", xdigits);
  #endif // FLATBUFFERS_PREFER_PRINTF
  // clang-format on
}